

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  string *this;
  ProgramOptions po;
  char *end;
  allocator local_b1;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  bool local_70;
  bool local_6f;
  bool local_6e;
  uint local_6c;
  float fStack_68;
  uint local_64;
  unsigned_long local_60;
  unsigned_long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b0._0_8_ = local_b0 + 0x10;
  local_b0._8_8_ = 0;
  local_b0[0x10] = '\0';
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70 = false;
  local_6f = false;
  local_6e = false;
  local_6c = 4;
  fStack_68 = 1e-05;
  local_64 = 0x40;
  local_60 = 2;
  local_58 = 0x400;
  if (argc == 1) {
    ProgramOptions::usage(argv);
  }
LAB_00102617:
  iVar1 = getopt(argc,argv,"hi:o:k:t:s:pebf:v:");
  lVar2 = 0x21;
  pcVar3 = "Some invalid option was supplied.";
  switch(iVar1) {
  case 0x62:
    local_6f = true;
    goto LAB_00102617;
  case 99:
  case 100:
  case 0x67:
  case 0x6a:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x72:
  case 0x75:
    goto switchD_0010263b_caseD_63;
  case 0x65:
    local_70 = true;
    goto LAB_00102617;
  case 0x66:
    local_60 = strtol(_optarg,(char **)local_50,10);
    goto LAB_00102617;
  case 0x68:
    goto switchD_0010263b_caseD_68;
  case 0x69:
    std::__cxx11::string::string((string *)local_50,_optarg,&local_b1);
    this = (string *)local_b0;
    break;
  case 0x6b:
    lVar2 = strtol(_optarg,(char **)local_50,10);
    local_6c = (uint)lVar2;
    goto LAB_00102617;
  case 0x6f:
    std::__cxx11::string::string((string *)local_50,_optarg,&local_b1);
    this = (string *)&local_90;
    break;
  case 0x70:
    local_6e = true;
    goto LAB_00102617;
  case 0x73:
    fStack_68 = strtof(_optarg,(char **)local_50);
    goto LAB_00102617;
  case 0x74:
    lVar2 = strtol(_optarg,(char **)local_50,10);
    local_64 = (uint)lVar2;
    goto LAB_00102617;
  case 0x76:
    local_58 = strtol(_optarg,(char **)local_50,10);
    goto LAB_00102617;
  default:
    if (iVar1 != 0x3f) {
      pcVar3 = "Some invalid option was supplied.";
      if (iVar1 == -1) {
        ProgramOptions::run((ProgramOptions *)local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_p != &local_80) {
          operator_delete(local_90._M_p);
        }
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_);
        }
        return 0;
      }
      goto switchD_0010263b_caseD_63;
    }
    lVar2 = 0x26;
    pcVar3 = "Options -i and -o require an argument.";
    if ((_optopt == 0x6f) || (_optopt == 0x69)) {
switchD_0010263b_caseD_63:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      goto switchD_0010263b_caseD_68;
    }
    goto LAB_00102617;
  }
  std::__cxx11::string::operator=(this,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  goto LAB_00102617;
switchD_0010263b_caseD_68:
  ProgramOptions::usage(argv);
  goto LAB_00102617;
}

Assistant:

int main(int argc, char *argv[]) {

  ProgramOptions po;

  if (argc == 1) {
    ProgramOptions::usage(argv);
  }

  // Use GNU getopt to parse command line options
  int opt;
  while ((opt = getopt(argc, argv, "hi:o:k:t:s:pebf:v:")) != -1) {
    switch (opt) {

      case 'h': {
        ProgramOptions::usage(argv);
        break;
      }

      case 'i': {
        po.input_file = std::string(optarg);
        break;
      }

      case 'o': {
        po.output_file = std::string(optarg);
        break;
      }

      case 'k': {
        char *end;
        po.clusters = (unsigned int) std::strtol(optarg, &end, 10);
        break;
      }

      case 't': {
        char *end;
        po.threshold_iters = (unsigned int) std::strtol(optarg, &end, 10);
        break;
      }

      case 'f': {
        char *end;
        po.features = (unsigned long) std::strtol(optarg, &end, 10);
        break;
      }

      case 'v': {
        char *end;
        po.vectors = (unsigned long) std::strtol(optarg, &end, 10);
        break;
      }

      case 's': {
        char *end;
        po.scaling_factor = std::strtof(optarg, &end);
        break;
      }

      case 'p': {
        po.plot_outputs = true;
        break;
      }

      case 'e': {
        po.generate_example = true;
        break;
      }

      case 'b': {
        po.generate_benchmark = true;
        break;
      }

      case '?':
        if ((optopt == 'i') || (optopt == 'o')) {
          std::cerr << "Options -i and -o require an argument." << std::endl;
          ProgramOptions::usage(argv);
        }
        break;

      default: {
        std::cerr << "Some invalid option was supplied." << std::endl;
        ProgramOptions::usage(argv);
        break;
      }

    }
  }

  po.run();

  return 0;
}